

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.hpp
# Opt level: O2

void __thiscall Card::~Card(Card *this)

{
  this->_vptr_Card = (_func_int **)&PTR_effectBonus_00116120;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual bool ChainHoldings(list<Card*>, Card*) { return false; }